

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O2

Gia_Man_t * Gia_ManUnrollInit(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  ulong uVar7;
  uint nCapMin;
  int iVar8;
  int f;
  
  nCapMin = p->nObjs * nFrames;
  Vec_IntGrow(&p->vCopies,nCapMin);
  uVar4 = 0;
  uVar7 = 0;
  if (0 < (int)nCapMin) {
    uVar7 = (ulong)nCapMin;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    (p->vCopies).pArray[uVar4] = -1;
  }
  (p->vCopies).nSize = nCapMin;
  p_00 = Gia_ManStart(p->nObjs * nFrames);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  Gia_ManHashAlloc(p_00);
  iVar8 = 0;
  while ((iVar8 < p->nRegs &&
         (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
    Gia_ObjSetCopyF(p,0,pGVar6,0);
    iVar8 = iVar8 + 1;
  }
  iVar1 = nFrames + -1;
  iVar8 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  while (f = iVar8, f != nFrames) {
    iVar8 = 0;
    Gia_ObjSetCopyF(p,f,p->pObjs,0);
    while ((iVar8 < p->vCis->nSize - p->nRegs &&
           (pGVar6 = Gia_ManCi(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
      iVar2 = Gia_ManAppendCi(p_00);
      Gia_ObjSetCopyF(p,f,pGVar6,iVar2);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar2 = Gia_ObjFanin0CopyF(p,f,pGVar6);
        iVar3 = Gia_ObjCopyF(p,f,pGVar6 + -(ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff));
        iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pGVar6 >> 0x3d) & 1);
        iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
        Gia_ObjSetCopyF(p,f,pGVar6,iVar2);
      }
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
      iVar2 = Gia_ObjFanin0CopyF(p,f,pGVar6);
      Gia_ObjSetCopyF(p,f,pGVar6,iVar2);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCos->nSize - p->nRegs &&
           (pGVar6 = Gia_ManCo(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
      iVar2 = Gia_ObjCopyF(p,f,pGVar6);
      Gia_ManAppendCo(p_00,iVar2);
      iVar8 = iVar8 + 1;
    }
    if (f == iVar1) break;
    iVar8 = f + 1;
    iVar2 = 0;
    while (((iVar2 < p->nRegs &&
            (pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar2), pGVar6 != (Gia_Obj_t *)0x0))
           && (pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar2), pObj != (Gia_Obj_t *)0x0)))
    {
      iVar3 = Gia_ObjCopyF(p,f,pGVar6);
      Gia_ObjSetCopyF(p,iVar8,pObj,iVar3);
      iVar2 = iVar2 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManUnrollInit( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int f, i;
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachAnd( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjCopyF(p, f, pObj) );
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}